

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O2

void __thiscall VMStack::addFrame(VMStack *this,Frame *frame)

{
  Frame *local_8;
  
  local_8 = frame;
  std::deque<Frame_*,_std::allocator<Frame_*>_>::push_back
            ((deque<Frame_*,_std::allocator<Frame_*>_> *)this,&local_8);
  return;
}

Assistant:

void VMStack::addFrame(Frame *frame) {
    // Verifica se a stack está cheia
//    if (_frameStack.size() >= FRAME_MAX_SIZE) {
//        cerr << "StackOverflowError" << endl;
//        exit(1);
//    }
    
    _frameStack.push(frame);
}